

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O1

wstring * __thiscall
lzstring::LZString::Compress
          (wstring *__return_storage_ptr__,LZString *this,wstring *input,int bitsPerChar,
          GetCharFromIntFunc *func)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer pwVar2;
  int iVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  iterator iVar8;
  uint *puVar9;
  undefined8 uVar10;
  int iVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  double dVar18;
  wstring contextStr;
  wstring contextW;
  wstring contextWc;
  StringDict contextDict;
  StringFlagDict contextFlagDict;
  int local_150;
  int local_14c;
  int local_13c;
  key_type local_130;
  key_type local_110;
  long *local_f0;
  ulong local_e8;
  long local_e0 [2];
  key_type local_d0;
  wstring *local_b0;
  ulong local_a8;
  _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a0;
  _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  if (input->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  }
  else {
    local_a0._M_buckets = &local_a0._M_single_bucket;
    local_a0._M_bucket_count = 1;
    local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_a0._M_element_count = 0;
    local_a0._M_rehash_policy._M_max_load_factor = 1.0;
    local_a0._M_rehash_policy._M_next_resize = 0;
    local_a0._M_single_bucket = (__node_base_ptr)0x0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    iVar14 = 0;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = L'\0';
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = L'\0';
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
    wVar13 = (wchar_t)__return_storage_ptr__;
    if (input->_M_string_length == 0) {
      local_14c = 2;
      local_150 = 2;
      iVar11 = 0;
    }
    else {
      iVar16 = bitsPerChar + -1;
      local_13c = 3;
      local_150 = 2;
      uVar7 = 0;
      iVar11 = 0;
      iVar14 = 0;
      local_14c = 2;
      local_b0 = input;
      do {
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        local_a8 = uVar7;
        std::__cxx11::wstring::_M_construct((ulong)&local_130,L'\x01');
        iVar4 = std::
                _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_a0,&local_130);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          pmVar5 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_a0,&local_130);
          *pmVar5 = local_13c;
          pmVar6 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_68,&local_130);
          local_13c = local_13c + 1;
          *pmVar6 = true;
        }
        local_f0 = local_e0;
        std::__cxx11::wstring::_M_construct<wchar_t*>
                  ((wstring *)&local_f0,local_110._M_dataplus._M_p,
                   local_110._M_dataplus._M_p + local_110._M_string_length);
        std::__cxx11::wstring::_M_replace_aux((ulong)&local_f0,local_e8,0,L'\x01');
        std::__cxx11::wstring::operator=((wstring *)&local_d0,(wstring *)&local_f0);
        if (local_f0 != local_e0) {
          operator_delete(local_f0,local_e0[0] * 4 + 4);
        }
        iVar4 = std::
                _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_a0,&local_d0);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          iVar8 = std::
                  _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&local_68,&local_110);
          if (iVar8.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_true>
              ._M_cur == (__node_type *)0x0) {
            puVar9 = (uint *)std::__detail::
                             _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                           *)&local_a0,&local_110);
            if (local_150 != 0) {
              lVar17 = (long)local_150;
              uVar15 = *puVar9;
              do {
                iVar14 = (uVar15 & 1) + iVar14 * 2;
                if (iVar11 == iVar16) {
                  local_f0 = (long *)CONCAT44(local_f0._4_4_,iVar14);
                  if ((func->super__Function_base)._M_manager == (_Manager_type)0x0)
                  goto LAB_00107668;
                  (*func->_M_invoker)((_Any_data *)func,(int *)&local_f0);
                  iVar14 = 0;
                  std::__cxx11::wstring::push_back(wVar13);
                  iVar11 = 0;
                }
                else {
                  iVar11 = iVar11 + 1;
                }
                uVar15 = (int)uVar15 >> 1;
                lVar17 = lVar17 + -1;
              } while (lVar17 != 0);
            }
          }
          else {
            lVar17 = (long)local_150;
            if (*local_110._M_dataplus._M_p < L'Ā') {
              if (local_150 != 0) {
                do {
                  iVar14 = iVar14 * 2;
                  if (iVar11 == iVar16) {
                    local_f0 = (long *)CONCAT44(local_f0._4_4_,iVar14);
                    if ((func->super__Function_base)._M_manager == (_Manager_type)0x0)
                    goto LAB_0010766d;
                    (*func->_M_invoker)((_Any_data *)func,(int *)&local_f0);
                    iVar14 = 0;
                    std::__cxx11::wstring::push_back(wVar13);
                    iVar11 = 0;
                  }
                  else {
                    iVar11 = iVar11 + 1;
                  }
                  lVar17 = lVar17 + -1;
                } while (lVar17 != 0);
              }
              wVar12 = *local_110._M_dataplus._M_p;
              lVar17 = 8;
              do {
                iVar14 = (wVar12 & 1U) + iVar14 * 2;
                if (iVar11 == iVar16) {
                  local_f0 = (long *)CONCAT44(local_f0._4_4_,iVar14);
                  if ((func->super__Function_base)._M_manager == (_Manager_type)0x0)
                  goto LAB_00107663;
                  (*func->_M_invoker)((_Any_data *)func,(int *)&local_f0);
                  iVar14 = 0;
                  std::__cxx11::wstring::push_back(wVar13);
                  iVar11 = 0;
                }
                else {
                  iVar11 = iVar11 + 1;
                }
                wVar12 = wVar12 >> 1;
                lVar17 = lVar17 + -1;
              } while (lVar17 != 0);
            }
            else {
              if (local_150 != 0) {
                iVar3 = 1;
                do {
                  iVar14 = iVar3 + iVar14 * 2;
                  if (iVar11 == iVar16) {
                    local_f0 = (long *)CONCAT44(local_f0._4_4_,iVar14);
                    if ((func->super__Function_base)._M_manager == (_Manager_type)0x0)
                    goto LAB_00107672;
                    (*func->_M_invoker)((_Any_data *)func,(int *)&local_f0);
                    iVar14 = 0;
                    std::__cxx11::wstring::push_back(wVar13);
                    iVar11 = 0;
                  }
                  else {
                    iVar11 = iVar11 + 1;
                  }
                  iVar3 = 0;
                  lVar17 = lVar17 + -1;
                } while (lVar17 != 0);
              }
              wVar12 = *local_110._M_dataplus._M_p;
              lVar17 = 0x10;
              do {
                iVar14 = (wVar12 & 1U) + iVar14 * 2;
                if (iVar11 == iVar16) {
                  local_f0 = (long *)CONCAT44(local_f0._4_4_,iVar14);
                  if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
                    std::__throw_bad_function_call();
                    goto LAB_00107663;
                  }
                  (*func->_M_invoker)((_Any_data *)func,(int *)&local_f0);
                  iVar14 = 0;
                  std::__cxx11::wstring::push_back(wVar13);
                  iVar11 = 0;
                }
                else {
                  iVar11 = iVar11 + 1;
                }
                wVar12 = wVar12 >> 1;
                lVar17 = lVar17 + -1;
              } while (lVar17 != 0);
            }
            local_14c = local_14c + -1;
            if (local_14c == 0) {
              dVar18 = ldexp(1.0,local_150);
              local_14c = (int)dVar18;
              local_150 = local_150 + 1;
            }
            std::
            _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_M_erase(&local_68,&local_110);
          }
          local_14c = local_14c + -1;
          if (local_14c == 0) {
            dVar18 = ldexp(1.0,local_150);
            local_14c = (int)dVar18;
            local_150 = local_150 + 1;
          }
          pmVar5 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_a0,&local_d0);
          *pmVar5 = local_13c;
          std::__cxx11::wstring::_M_assign((wstring *)&local_110);
          local_13c = local_13c + 1;
        }
        else {
          std::__cxx11::wstring::_M_assign((wstring *)&local_110);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        uVar7 = local_a8 + 1;
      } while (uVar7 < local_b0->_M_string_length);
    }
    if (local_110._M_string_length != 0) {
      iVar8 = std::
              _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_68,&local_110);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_true>
          ._M_cur == (__node_type *)0x0) {
        puVar9 = (uint *)std::__detail::
                         _Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&local_a0,&local_110);
        if (local_150 != 0) {
          lVar17 = (long)local_150;
          uVar15 = *puVar9;
          do {
            iVar14 = (uVar15 & 1) + iVar14 * 2;
            if (iVar11 == bitsPerChar + -1) {
              local_130._M_dataplus._M_p._0_4_ = iVar14;
              if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00107686;
              (*func->_M_invoker)((_Any_data *)func,(int *)&local_130);
              iVar14 = 0;
              std::__cxx11::wstring::push_back(wVar13);
              iVar11 = 0;
            }
            else {
              iVar11 = iVar11 + 1;
            }
            uVar15 = (int)uVar15 >> 1;
            lVar17 = lVar17 + -1;
          } while (lVar17 != 0);
        }
      }
      else {
        lVar17 = (long)local_150;
        if (*local_110._M_dataplus._M_p < L'Ā') {
          if (local_150 != 0) {
            do {
              iVar14 = iVar14 * 2;
              if (iVar11 == bitsPerChar + -1) {
                local_130._M_dataplus._M_p._0_4_ = iVar14;
                if ((func->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_0010768b;
                (*func->_M_invoker)((_Any_data *)func,(int *)&local_130);
                iVar14 = 0;
                std::__cxx11::wstring::push_back(wVar13);
                iVar11 = 0;
              }
              else {
                iVar11 = iVar11 + 1;
              }
              lVar17 = lVar17 + -1;
            } while (lVar17 != 0);
          }
          wVar12 = *local_110._M_dataplus._M_p;
          lVar17 = 8;
          do {
            iVar14 = (wVar12 & 1U) + iVar14 * 2;
            if (iVar11 == bitsPerChar + -1) {
              local_130._M_dataplus._M_p._0_4_ = iVar14;
              if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0010767c;
              (*func->_M_invoker)((_Any_data *)func,(int *)&local_130);
              iVar14 = 0;
              std::__cxx11::wstring::push_back(wVar13);
              iVar11 = 0;
            }
            else {
              iVar11 = iVar11 + 1;
            }
            wVar12 = wVar12 >> 1;
            lVar17 = lVar17 + -1;
          } while (lVar17 != 0);
        }
        else {
          if (local_150 != 0) {
            iVar16 = 1;
            do {
              iVar14 = iVar16 + iVar14 * 2;
              if (iVar11 == bitsPerChar + -1) {
                local_130._M_dataplus._M_p._0_4_ = iVar14;
                if ((func->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_00107690;
                (*func->_M_invoker)((_Any_data *)func,(int *)&local_130);
                iVar14 = 0;
                std::__cxx11::wstring::push_back(wVar13);
                iVar11 = 0;
              }
              else {
                iVar11 = iVar11 + 1;
              }
              iVar16 = 0;
              lVar17 = lVar17 + -1;
            } while (lVar17 != 0);
          }
          wVar12 = *local_110._M_dataplus._M_p;
          lVar17 = 0x10;
          do {
            iVar14 = (wVar12 & 1U) + iVar14 * 2;
            if (iVar11 == bitsPerChar + -1) {
              local_130._M_dataplus._M_p._0_4_ = iVar14;
              if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00107681;
              (*func->_M_invoker)((_Any_data *)func,(int *)&local_130);
              iVar14 = 0;
              std::__cxx11::wstring::push_back(wVar13);
              iVar11 = 0;
            }
            else {
              iVar11 = iVar11 + 1;
            }
            wVar12 = wVar12 >> 1;
            lVar17 = lVar17 + -1;
          } while (lVar17 != 0);
        }
        local_14c = local_14c + -1;
        if (local_14c == 0) {
          dVar18 = ldexp(1.0,local_150);
          local_14c = (int)dVar18;
          local_150 = local_150 + 1;
        }
        std::
        _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_erase(&local_68,&local_110);
      }
      if (local_14c == 1) {
        ldexp(1.0,local_150);
        local_150 = local_150 + 1;
      }
    }
    if (local_150 != 0) {
      lVar17 = (long)local_150;
      uVar15 = 2;
      do {
        iVar14 = (uVar15 & 1) + iVar14 * 2;
        if (iVar11 == bitsPerChar + -1) {
          local_130._M_dataplus._M_p._0_4_ = iVar14;
          if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00107677;
          (*func->_M_invoker)((_Any_data *)func,(int *)&local_130);
          iVar14 = 0;
          std::__cxx11::wstring::push_back(wVar13);
          iVar11 = 0;
        }
        else {
          iVar11 = iVar11 + 1;
        }
        uVar15 = uVar15 >> 1;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    iVar11 = bitsPerChar - iVar11;
    do {
      iVar14 = iVar14 * 2;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    local_130._M_dataplus._M_p._0_4_ = iVar14;
    if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00107695;
    (*func->_M_invoker)((_Any_data *)func,(int *)&local_130);
    std::__cxx11::wstring::push_back(wVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT44(local_110.field_2._M_local_buf[1],local_110.field_2._M_local_buf[0])
                      * 4 + 4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT44(local_d0.field_2._M_local_buf[1],local_d0.field_2._M_local_buf[0]) *
                      4 + 4);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68);
    std::
    _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_a0);
  }
  return __return_storage_ptr__;
LAB_00107663:
  std::__throw_bad_function_call();
LAB_00107668:
  std::__throw_bad_function_call();
LAB_0010766d:
  std::__throw_bad_function_call();
LAB_00107672:
  std::__throw_bad_function_call();
LAB_00107677:
  std::__throw_bad_function_call();
LAB_0010767c:
  std::__throw_bad_function_call();
LAB_00107681:
  std::__throw_bad_function_call();
LAB_00107686:
  std::__throw_bad_function_call();
LAB_0010768b:
  std::__throw_bad_function_call();
LAB_00107690:
  std::__throw_bad_function_call();
LAB_00107695:
  uVar10 = std::__throw_bad_function_call();
  pwVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != paVar1) {
    operator_delete(pwVar2,paVar1->_M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT44(local_110.field_2._M_local_buf[1],local_110.field_2._M_local_buf[0]) *
                    4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT44(local_d0.field_2._M_local_buf[1],local_d0.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Hashtable<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a0);
  _Unwind_Resume(uVar10);
}

Assistant:

std::wstring LZString::Compress(const std::wstring &input, const int bitsPerChar, GetCharFromIntFunc func)
{
	if (input.empty())
		return std::wstring();

	int i = 0, value = 0;
	StringDict contextDict;
	StringFlagDict contextFlagDict;
	std::wstring contextWc;
	std::wstring contextW;
	int contextEnlargeIn = 2; // Compensate for the first entry which should not count
	int contextDictSize = 3;
	int contextNumBits = 2;
	std::wstring contextData;
	int contextDataVal = 0;
	int contextDataPosition = 0;

	for (size_t index = 0; index < input.size(); index++)
	{
		wchar_t contextC = input[index];
		std::wstring contextStr = std::wstring(1, contextC);
		if (contextDict.find(contextStr) == contextDict.end())
		{
			contextDict[contextStr] = contextDictSize++;
			contextFlagDict[contextStr] = true;
		}

		contextWc = contextW + contextC;
		if (contextDict.find(contextWc) != contextDict.end())
		{
			contextW = contextWc;
		}
		else
		{
			if (contextFlagDict.find(contextW) != contextFlagDict.end())
			{
				if ((int)contextW[0] < 256)
				{
					for (size_t i = 0; i < contextNumBits; i++)
					{
						contextDataVal = (contextDataVal << 1);
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
					}

					value = contextW[0];
					for (size_t i = 0; i < 8; i++)
					{
						contextDataVal = (contextDataVal << 1) | (value & 1);
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
						value = value >> 1;
					}
				}
				else
				{
					value = 1;
					for (size_t i = 0; i < contextNumBits; i++)
					{
						contextDataVal = (contextDataVal << 1) | value;
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
						value = 0;
					}

					value = contextW[0];
					for (size_t i = 0; i < 16; i++)
					{
						contextDataVal = (contextDataVal << 1) | (value & 1);
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
						value = value >> 1;
					}
				}
				contextEnlargeIn--;
				if (contextEnlargeIn == 0)
				{
					contextEnlargeIn = (int)pow(2, contextNumBits);
					contextNumBits++;
				}
				contextFlagDict.erase(contextW);
			}
			else
			{
				value = contextDict[contextW];
				for (size_t i = 0; i < contextNumBits; i++)
				{
					contextDataVal = (contextDataVal << 1) | (value & 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = value >> 1;
				}
			}
			contextEnlargeIn--;
			if (contextEnlargeIn == 0)
			{
				contextEnlargeIn = (int)pow(2, contextNumBits);
				contextNumBits++;
			}
			// Add wc to the dictionary
			contextDict[contextWc] = contextDictSize++;
			contextW = contextStr;
		}
	}

	// Output the code for w.
	if (!contextW.empty())
	{
		if (contextFlagDict.find(contextW) != contextFlagDict.end())
		{
			if (contextW[0] < 256)
			{
				for (size_t i = 0; i < contextNumBits; i++)
				{
					contextDataVal = (contextDataVal << 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
				}
				value = contextW[0];
				for (size_t i = 0; i < 8; i++)
				{
					contextDataVal = (contextDataVal << 1) | (value & 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = value >> 1;
				}
			}
			else
			{
				value = 1;
				for (size_t i = 0; i < contextNumBits; i++)
				{
					contextDataVal = (contextDataVal << 1) | value;
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = 0;
				}
				value = contextW[0];
				for (size_t i = 0; i < 16; i++)
				{
					contextDataVal = (contextDataVal << 1) | (value & 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = value >> 1;
				}
			}
			contextEnlargeIn--;
			if (contextEnlargeIn == 0)
			{
				contextEnlargeIn = (int)pow(2, contextNumBits);
				contextNumBits++;
			}
			contextFlagDict.erase(contextW);
		}
		else
		{
			value = contextDict[contextW];
			for (size_t i = 0; i < contextNumBits; i++)
			{
				contextDataVal = (contextDataVal << 1) | (value & 1);
				if (contextDataPosition == bitsPerChar - 1)
				{
					contextDataPosition = 0;
					contextData.push_back(func(contextDataVal));
					contextDataVal = 0;
				}
				else
				{
					contextDataPosition++;
				}
				value = value >> 1;
			}
		}

		contextEnlargeIn--;
		if (contextEnlargeIn == 0)
		{
			contextEnlargeIn = (int)pow(2, contextNumBits);
			contextNumBits++;
		}
	}

	// Mark the end of the stream
	value = 2;
	for (size_t i = 0; i < contextNumBits; i++)
	{
		contextDataVal = (contextDataVal << 1) | (value & 1);
		if (contextDataPosition == bitsPerChar - 1)
		{
			contextDataPosition = 0;
			contextData.push_back(func(contextDataVal));
			contextDataVal = 0;
		}
		else
		{
			contextDataPosition++;
		}
		value = value >> 1;
	}

	// Flush the last char
	while (true)
	{
		contextDataVal = (contextDataVal << 1);
		if (contextDataPosition == bitsPerChar - 1)
		{
			contextData.push_back(func(contextDataVal));
			break;
		}
		else
		{
			contextDataPosition++;
		}
	}

	return contextData;
}